

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O0

void slang::OS::printE(text_style *style,string_view text)

{
  text_style *in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  basic_string_view<char> text_00;
  FILE *unaff_retaddr;
  format_string<std::basic_string_view<char>_&> in_stack_00000008;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  FILE *f;
  
  if (capturingOutput) {
    std::__cxx11::string::operator+=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else if (showColorsStderr) {
    ::fmt::v11::print<std::basic_string_view<char,std::char_traits<char>>&>
              (unaff_retaddr,in_RDX,in_stack_00000008,in_RSI);
  }
  else {
    f = _stderr;
    text_00 = ::fmt::v11::detail::
              to_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
                        ((basic_string_view<char,_std::char_traits<char>_> *)0x5b694b);
    ::fmt::v11::detail::print(f,text_00);
  }
  return;
}

Assistant:

void OS::printE(const fmt::text_style& style, std::string_view text) {
    if (capturingOutput)
        capturedStderr += text;
    else if (showColorsStderr)
        fmt::print(stderr, style, "{}"sv, text);
    else
        fmt::detail::print(stderr, fmt::detail::to_string_view(text));
}